

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O2

TA_RetCode TA_GroupTableFree(TA_StringTable *table)

{
  TA_RetCode TVar1;
  
  TVar1 = TA_SUCCESS;
  if (table != (TA_StringTable *)0x0) {
    if ((int *)table->hiddenData == (int *)0x0) {
      TVar1 = TA_INTERNAL_ERROR|TA_LIB_NOT_INITIALIZE;
    }
    else if (*table->hiddenData == -0x5df44df5) {
      free(table);
    }
    else {
      TVar1 = TA_BAD_OBJECT;
    }
  }
  return TVar1;
}

Assistant:

TA_RetCode TA_GroupTableFree( TA_StringTable *table )
{
   TA_StringTablePriv *stringTablePriv;

   if( table )
   {
      stringTablePriv = (TA_StringTablePriv *)table->hiddenData;
      if( !stringTablePriv )
      {
         return TA_INTERNAL_ERROR(1);
      }

      if( stringTablePriv->magicNumber != TA_STRING_TABLE_GROUP_MAGIC_NB )
      {
         return TA_BAD_OBJECT;
      }

      TA_Free( table );
   }

   return TA_SUCCESS;
}